

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

AtomTypeSet * __thiscall OpenMD::SimInfo::getSimulatedAtomTypes(SimInfo *this)

{
  AtomTypeSet *in_RDI;
  Atom *atom;
  AtomIterator ai;
  Molecule *mol;
  MoleculeIterator mi;
  AtomTypeSet *atomTypes;
  AtomType *in_stack_ffffffffffffff78;
  SimInfo *in_stack_ffffffffffffff80;
  SimInfo *local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  Molecule *local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18 [3];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_28);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x14c5ba);
  local_20 = beginMolecule(in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78);
  while (local_20 != (Molecule *)0x0) {
    in_stack_ffffffffffffff80 =
         (SimInfo *)
         Molecule::beginAtom((Molecule *)in_stack_ffffffffffffff80,
                             (iterator *)in_stack_ffffffffffffff78);
    local_30 = in_stack_ffffffffffffff80;
    while (local_30 != (SimInfo *)0x0) {
      in_stack_ffffffffffffff78 = Atom::getAtomType((Atom *)local_30);
      std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
      insert((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)in_stack_ffffffffffffff80,(value_type *)in_stack_ffffffffffffff78);
      local_30 = (SimInfo *)
                 Molecule::nextAtom((Molecule *)in_stack_ffffffffffffff80,
                                    (iterator *)in_stack_ffffffffffffff78);
    }
    local_20 = nextMolecule(in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78)
    ;
  }
  return in_RDI;
}

Assistant:

AtomTypeSet SimInfo::getSimulatedAtomTypes() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;
    AtomTypeSet atomTypes;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atomTypes.insert(atom->getAtomType());
      }
    }

#ifdef IS_MPI

    // loop over the found atom types on this processor, and add their
    // numerical idents to a vector:

    vector<int> foundTypes;
    AtomTypeSet::iterator i;
    for (i = atomTypes.begin(); i != atomTypes.end(); ++i)
      foundTypes.push_back((*i)->getIdent());

    // count_local holds the number of found types on this processor
    int count_local = foundTypes.size();

    int nproc;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);

    // we need arrays to hold the counts and displacement vectors for
    // all processors
    vector<int> counts(nproc, 0);
    vector<int> disps(nproc, 0);

    // fill the counts array
    MPI_Allgather(&count_local, 1, MPI_INT, &counts[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    // use the processor counts to compute the displacement array
    disps[0]       = 0;
    int totalCount = counts[0];
    for (int iproc = 1; iproc < nproc; iproc++) {
      disps[iproc] = disps[iproc - 1] + counts[iproc - 1];
      totalCount += counts[iproc];
    }

    // we need a (possibly redundant) set of all found types:
    vector<int> ftGlobal(totalCount);

    // now spray out the foundTypes to all the other processors:
    MPI_Allgatherv(&foundTypes[0], count_local, MPI_INT, &ftGlobal[0],
                   &counts[0], &disps[0], MPI_INT, MPI_COMM_WORLD);

    vector<int>::iterator j;

    // foundIdents is a stl set, so inserting an already found ident
    // will have no effect.
    set<int> foundIdents;

    for (j = ftGlobal.begin(); j != ftGlobal.end(); ++j)
      foundIdents.insert((*j));

    // now iterate over the foundIdents and get the actual atom types
    // that correspond to these:
    set<int>::iterator it;
    for (it = foundIdents.begin(); it != foundIdents.end(); ++it)
      atomTypes.insert(forceField_->getAtomType((*it)));

#endif

    return atomTypes;
  }